

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var cs_impl::runtime_cs_ext::wait_worker(callable *func,vector *args)

{
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  operator()(&func->mFunc,args);
  return (var)(proxy *)func;
}

Assistant:

var wait_worker(const cs::callable &func, cs::vector &args)
		{
			try {
				return func.call(args);
			}
			catch (const lang_error &le) {
				std::cerr << "wait thread terminated after throwing an instance of runtime exception" << std::endl;
				std::cerr << "what(): " << le.what() << std::endl;
			}
			catch (const std::exception &e) {
				std::cerr << "wait thread terminated after throwing an instance of exception" << std::endl;
				std::cerr << "what(): " << e.what() << std::endl;
			}
			catch (...) {
				std::cerr << "wait thread terminated after throwing an instance of unknown exception" << std::endl;
			}
			return null_pointer;
		}